

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

void __thiscall
CVmObjGramProd::add_alt
          (CVmObjGramProd *this,vm_obj_id_t self,CTcGramProdAlt *alt,vm_obj_id_t dict,
          vm_obj_id_t match)

{
  undefined8 uVar1;
  vm_obj_id_t vVar2;
  int iVar3;
  size_t i;
  CTcGramProdAlt *pCVar4;
  vmgram_alt_info *this_00;
  ulong uVar5;
  vmgram_undo_rec *this_01;
  vmgram_tok_info *this_02;
  size_t ntoks;
  
  uVar1 = *(undefined8 *)((this->super_CVmObject).ext_ + 0x38);
  ntoks = 0xffffffffffffffff;
  pCVar4 = alt;
  do {
    pCVar4 = (CTcGramProdAlt *)pCVar4->tok_head_;
    ntoks = ntoks + 1;
  } while (pCVar4 != (CTcGramProdAlt *)0x0);
  this_00 = (vmgram_alt_info *)operator_new(0x20);
  vmgram_alt_info::vmgram_alt_info(this_00,ntoks);
  this_00->proc_obj = match;
  iVar3 = alt->badness_;
  this_00->score = alt->score_;
  this_00->badness = iVar3;
  this_02 = this_00->toks;
  do {
    alt = (CTcGramProdAlt *)alt->tok_head_;
    if (alt == (CTcGramProdAlt *)0x0) {
      iVar3 = (int)uVar1;
      insert_alt(this,self,(long)iVar3,this_00);
      this_01 = (vmgram_undo_rec *)operator_new(0x10);
      this_01->idx = iVar3;
      this_01->op = 3;
      this_01->alt = (vmgram_alt_info *)0x0;
      iVar3 = CVmUndo::add_new_record_ptr_key(G_undo_X,self,this_01);
      if (iVar3 == 0) {
        vmgram_undo_rec::~vmgram_undo_rec(this_01);
        operator_delete(this_01,0x10);
        return;
      }
      return;
    }
    this_02->prop = *(tctarg_prop_id_t *)&alt->score_;
    switch(*(tcgram_tok_type *)&alt->tok_tail_) {
    case TCGRAM_UNKNOWN:
      this_02->typ = '\0';
      break;
    case TCGRAM_PROD:
      this_02->typ = '\x01';
      vVar2 = *(vm_obj_id_t *)
               ((((anon_union_24_5_105256e3_for_val_ *)&alt->dict_)->str_).txt_ + 0x28);
      goto LAB_002882a4;
    case TCGRAM_PART_OF_SPEECH:
      this_02->typ = '\x02';
      (this_02->typinfo).speech_prop = ((anon_union_24_5_105256e3_for_val_ *)&alt->dict_)->prop_;
      break;
    case TCGRAM_LITERAL:
      vmgram_tok_info::set_literal
                (this_02,(((anon_union_24_5_105256e3_for_val_ *)&alt->dict_)->str_).txt_,
                 (size_t)alt->obj_sym_);
      if (G_predef_X.misc_vocab != 0 && dict != 0) {
        CVmObjDict::add_word
                  ((CVmObjDict *)(G_obj_table_X.pages_[dict >> 0xc] + (dict & 0xfff)),dict,
                   (this_02->typinfo).lit.str,(this_02->typinfo).lit.len,self,G_predef_X.misc_vocab)
        ;
      }
      break;
    case TCGRAM_TOKEN_TYPE:
      this_02->typ = '\x04';
      vVar2 = *(vm_obj_id_t *)&alt->dict_;
LAB_002882a4:
      (this_02->typinfo).prod_obj = vVar2;
      break;
    case TCGRAM_STAR:
      this_02->typ = '\x05';
      break;
    case TCGRAM_PART_OF_SPEECH_LIST:
      vmgram_tok_info::set_nspeech(this_02,(size_t)alt->obj_sym_);
      for (uVar5 = 0; uVar5 < (this_02->typinfo).nspeech.cnt; uVar5 = uVar5 + 1) {
        (this_02->typinfo).nspeech.props[uVar5] =
             *(vm_prop_id_t *)((long)&alt->nxt_->tok_head_ + uVar5 * 2);
      }
    }
    this_02 = this_02 + 1;
  } while( true );
}

Assistant:

void CVmObjGramProd::add_alt(VMG_ vm_obj_id_t self, CTcGramProdAlt *alt,
                             vm_obj_id_t dict, vm_obj_id_t match)
{
    /* add it at the last position */
    int idx = get_ext()->alt_cnt_;

    /* count the tokens in the rule */
    CTcGramProdTok *tok;
    int ntoks;
    for (ntoks = 0, tok = alt->get_tok_head() ; tok != 0 ;
         ++ntoks, tok = tok->get_next()) ;

    /* create our internal alt object */
    vmgram_alt_info *ai = new vmgram_alt_info(ntoks);

    /* set the attributes */
    ai->proc_obj = match;
    ai->score = alt->get_score();
    ai->badness = alt->get_badness();

    /* translate from the parsed token list to our internal token list */
    vmgram_tok_info *ti = ai->toks;
    for (tok = alt->get_tok_head() ; tok != 0 ; ++ti, tok = tok->get_next())
    {
        /* set the property association */
        ti->prop = tok->get_prop_assoc();

        /* set the type and type-specific data */
        switch (tok->get_type())
        {
        case TCGRAM_UNKNOWN:
            ti->typ = VMGRAM_MATCH_UNDEF;
            break;

        case TCGRAM_PROD:
            ti->typ = VMGRAM_MATCH_PROD;
            ti->typinfo.prod_obj = tok->getval_prod()->get_obj_id();
            break;

        case TCGRAM_PART_OF_SPEECH:
            ti->typ = VMGRAM_MATCH_SPEECH;
            ti->typinfo.speech_prop = tok->getval_part_of_speech();
            break;

        case TCGRAM_LITERAL:
            /* set the literal in our token structure */
            ti->set_literal(
                tok->getval_literal_txt(), tok->getval_literal_len());

            /* add the token to the dictionary */
            if (dict != VM_INVALID_OBJ
                && G_predef->misc_vocab != VM_INVALID_PROP)
            {
                ((CVmObjDict *)vm_objp(vmg_ dict))->add_word(
                    vmg_ dict, ti->typinfo.lit.str, ti->typinfo.lit.len,
                    self, G_predef->misc_vocab);
            }
            break;

        case TCGRAM_TOKEN_TYPE:
            ti->typ = VMGRAM_MATCH_TOKTYPE;
            ti->typinfo.toktyp_enum = tok->getval_token_type();
            break;

        case TCGRAM_STAR:
            ti->typ = VMGRAM_MATCH_STAR;
            break;

        case TCGRAM_PART_OF_SPEECH_LIST:
            ti->set_nspeech(tok->getval_part_list_len());
            for (size_t i = 0 ; i < ti->typinfo.nspeech.cnt ; ++i)
                ti->typinfo.nspeech.props[i] = tok->getval_part_list_ele(i);
            break;
        }
    }

    /* add it to the object */
    insert_alt(self, idx, ai);

    /* create and add an undo record */
    vmgram_undo_rec *rec = new vmgram_undo_rec(VMGRAM_UNDO_ADDED, idx, 0);
    if (!G_undo->add_new_record_ptr_key(vmg_ self, rec))
        delete rec;
}